

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  size_type sVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  __type _Var6;
  double dVar7;
  int k_5;
  float sum_6;
  float *kptr_4;
  float *ptr_4;
  int j_8;
  float *outptr_5;
  int i_6;
  int k_4;
  float sum_5;
  float *vptr;
  float *qkptr;
  int j_7;
  float *outptr_4;
  int i_5;
  Mat xvm;
  Mat xqkm;
  int j_6;
  int j_5;
  float sum_4;
  int j_4;
  float max;
  float *ptr_3;
  int i_4;
  Mat outm_4;
  int k_3;
  float sum_3;
  float *kptr_3;
  float *qptr;
  int j_3;
  float *outptr_3;
  int i_3;
  Mat outm_3;
  Mat xkm;
  Mat xqm;
  float *outptr_2;
  int k_2;
  float sum_2;
  float *kptr_2;
  float *ptr_2;
  int j_2;
  int i_2;
  Mat outm_2;
  int k_1;
  float sum_1;
  float *kptr_1;
  float *ptr_1;
  int j_1;
  float *outptr_1;
  int i_1;
  Mat outm_1;
  int k;
  float sum;
  float *kptr;
  float *ptr;
  int j;
  float *outptr;
  int i;
  Mat outm;
  int q;
  float inv_sqrt_embed_dim_per_head;
  Mat xqkv;
  Mat xqk;
  Mat xv;
  Mat xk;
  Mat xq;
  Mat *top_blob;
  int embed_dim_per_head;
  int seqlen;
  Mat *v_blob;
  Mat *k_blob;
  Mat *q_blob;
  size_t in_stack_fffffffffffff8e8;
  Mat *in_stack_fffffffffffff8f0;
  Allocator *in_stack_fffffffffffff8f8;
  Mat *in_stack_fffffffffffff900;
  undefined8 in_stack_fffffffffffff908;
  Mat *in_stack_fffffffffffff910;
  Mat *in_stack_fffffffffffff918;
  const_reference local_640;
  const_reference local_638;
  int local_628;
  float local_624;
  float *local_620;
  Mat local_618;
  float *local_5d0;
  int local_5c4;
  float *local_5c0;
  int local_5b4;
  int local_5b0;
  float local_5ac;
  float *local_5a8;
  Mat *local_5a0;
  int local_594;
  Mat local_590;
  Mat *local_548;
  int local_53c;
  Mat local_538;
  Mat local_4f0;
  int local_4a4;
  int local_4a0;
  float local_49c;
  int local_498;
  float local_494;
  float *local_490;
  int local_484;
  Mat local_480;
  int local_438;
  float local_434;
  float *local_430;
  float *local_428;
  int local_41c;
  float *local_418;
  int local_40c;
  Mat local_408;
  Mat local_3c0;
  Mat local_378;
  float *local_330;
  int local_328;
  float local_324;
  float *local_320;
  float *local_318;
  int local_310;
  int local_30c;
  Mat local_308;
  int local_2c0;
  float local_2bc;
  float *local_2b8;
  float *local_2b0;
  int local_2a4;
  float *local_2a0;
  int local_294;
  Mat local_290;
  int local_248;
  float local_244;
  float *local_240;
  float *local_238;
  int local_22c;
  float *local_228;
  int local_21c;
  Mat local_218;
  int local_1d0;
  float local_1cc;
  reference local_50;
  int local_48;
  int local_44;
  const_reference local_40;
  const_reference local_38;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
  if (sVar2 == 1) {
    local_638 = local_30;
  }
  else {
    local_638 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  }
  local_38 = local_638;
  sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
  if (sVar2 == 1) {
    local_640 = local_30;
  }
  else {
    local_640 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
  }
  local_40 = local_640;
  local_44 = local_30->h;
  local_48 = *(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0xd4);
  local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  Mat::create(in_stack_fffffffffffff910,(int)((ulong)in_stack_fffffffffffff908 >> 0x20),
              (int)in_stack_fffffffffffff908,(size_t)in_stack_fffffffffffff900,
              in_stack_fffffffffffff8f8);
  bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
  iVar5 = (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20);
  if (bVar1) {
    local_4 = -1;
  }
  else {
    Mat::Mat(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
             (int)in_stack_fffffffffffff8f8,iVar5,in_stack_fffffffffffff8e8,(Allocator *)0x91fa51);
    Mat::Mat(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
             (int)in_stack_fffffffffffff8f8,iVar5,in_stack_fffffffffffff8e8,(Allocator *)0x91fa8e);
    Mat::Mat(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
             (int)in_stack_fffffffffffff8f8,iVar5,in_stack_fffffffffffff8e8,(Allocator *)0x91facb);
    Mat::Mat(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
             (int)in_stack_fffffffffffff8f8,iVar5,in_stack_fffffffffffff8e8,(Allocator *)0x91fb03);
    Mat::Mat(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
             (int)in_stack_fffffffffffff8f8,iVar5,in_stack_fffffffffffff8e8,(Allocator *)0x91fb40);
    _Var6 = std::sqrt<int>(local_48);
    local_1cc = (float)(1.0 / _Var6);
    for (local_1d0 = 0; local_1d0 < *(int *)(in_RDI + 0xd4); local_1d0 = local_1d0 + 1) {
      Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
      for (local_21c = 0; local_21c < local_44; local_21c = local_21c + 1) {
        local_228 = Mat::row(&local_218,local_21c);
        for (local_22c = 0; local_22c < local_48; local_22c = local_22c + 1) {
          local_238 = Mat::row(local_30,local_21c);
          local_240 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xe0));
          local_240 = local_240 + *(int *)(in_RDI + 0xd0) * (local_1d0 * local_48 + local_22c);
          pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x128),(long)(local_1d0 * local_48 + local_22c))
          ;
          local_244 = *pfVar3;
          for (local_248 = 0; local_248 < *(int *)(in_RDI + 0xd0); local_248 = local_248 + 1) {
            local_244 = *local_238 * *local_240 + local_244;
            local_240 = local_240 + 1;
            local_238 = local_238 + 1;
          }
          local_228[local_22c] = local_244 * local_1cc;
        }
      }
      Mat::~Mat((Mat *)0x91fe87);
      Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
      for (local_294 = 0; local_294 < local_44; local_294 = local_294 + 1) {
        local_2a0 = Mat::row(&local_290,local_294);
        for (local_2a4 = 0; local_2a4 < local_48; local_2a4 = local_2a4 + 1) {
          local_2b0 = Mat::row(local_38,local_294);
          local_2b8 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x170));
          local_2b8 = local_2b8 + *(int *)(in_RDI + 0xd0) * (local_1d0 * local_48 + local_2a4);
          pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)(local_1d0 * local_48 + local_2a4))
          ;
          local_2bc = *pfVar3;
          for (local_2c0 = 0; local_2c0 < *(int *)(in_RDI + 0xd0); local_2c0 = local_2c0 + 1) {
            local_2bc = *local_2b0 * *local_2b8 + local_2bc;
            local_2b8 = local_2b8 + 1;
            local_2b0 = local_2b0 + 1;
          }
          local_2a0[local_2a4] = local_2bc;
        }
      }
      Mat::~Mat((Mat *)0x9200e7);
      Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
      for (local_30c = 0; local_30c < local_48; local_30c = local_30c + 1) {
        for (local_310 = 0; local_310 < local_44; local_310 = local_310 + 1) {
          local_318 = Mat::row(local_40,local_310);
          local_320 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x200));
          local_320 = local_320 + *(int *)(in_RDI + 0xd0) * (local_1d0 * local_48 + local_30c);
          pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x248),(long)(local_1d0 * local_48 + local_30c))
          ;
          local_324 = *pfVar3;
          for (local_328 = 0; local_328 < *(int *)(in_RDI + 0xd0); local_328 = local_328 + 1) {
            local_324 = *local_318 * *local_320 + local_324;
            local_320 = local_320 + 1;
            local_318 = local_318 + 1;
          }
          local_330 = Mat::row(&local_308,local_30c);
          local_330[local_310] = local_324;
        }
      }
      Mat::~Mat((Mat *)0x920335);
      Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
      Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
      Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
      for (local_40c = 0; local_40c < local_44; local_40c = local_40c + 1) {
        local_418 = Mat::row(&local_408,local_40c);
        for (local_41c = 0; local_41c < local_44; local_41c = local_41c + 1) {
          local_428 = Mat::row(&local_378,local_40c);
          local_430 = Mat::row(&local_3c0,local_41c);
          local_434 = 0.0;
          for (local_438 = 0; local_438 < local_48; local_438 = local_438 + 1) {
            local_434 = *local_428 * *local_430 + local_434;
            local_430 = local_430 + 1;
            local_428 = local_428 + 1;
          }
          local_418[local_41c] = local_434;
        }
      }
      Mat::~Mat((Mat *)0x92057c);
      Mat::~Mat((Mat *)0x920589);
      Mat::~Mat((Mat *)0x920596);
      Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
      for (local_484 = 0; local_484 < local_44; local_484 = local_484 + 1) {
        local_490 = Mat::row(&local_480,local_484);
        local_494 = -3.4028235e+38;
        for (local_498 = 0; local_498 < local_44; local_498 = local_498 + 1) {
          pfVar3 = std::max<float>(&local_494,local_490 + local_498);
          local_494 = *pfVar3;
        }
        local_49c = 0.0;
        for (local_4a0 = 0; local_4a0 < local_44; local_4a0 = local_4a0 + 1) {
          dVar7 = std::exp((double)(ulong)(uint)(local_490[local_4a0] - local_494));
          local_490[local_4a0] = SUB84(dVar7,0);
          local_49c = local_490[local_4a0] + local_49c;
        }
        for (local_4a4 = 0; local_4a4 < local_44; local_4a4 = local_4a4 + 1) {
          local_490[local_4a4] = local_490[local_4a4] / local_49c;
        }
      }
      Mat::~Mat((Mat *)0x9207e9);
      Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
      Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
      for (local_53c = 0; local_53c < local_44; local_53c = local_53c + 1) {
        Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
        in_stack_fffffffffffff918 = (Mat *)Mat::row(&local_590,local_1d0);
        Mat::~Mat((Mat *)0x92088a);
        local_548 = in_stack_fffffffffffff918;
        for (local_594 = 0; local_594 < local_48; local_594 = local_594 + 1) {
          in_stack_fffffffffffff910 = (Mat *)Mat::row(&local_4f0,local_53c);
          local_5a0 = in_stack_fffffffffffff910;
          local_5a8 = Mat::row(&local_538,local_594);
          local_5ac = 0.0;
          for (local_5b0 = 0; local_5b0 < local_44; local_5b0 = local_5b0 + 1) {
            local_5ac = *(float *)&local_5a0->data * *local_5a8 + local_5ac;
            local_5a8 = local_5a8 + 1;
            local_5a0 = (Mat *)((long)&local_5a0->data + 4);
          }
          *(float *)((long)&local_548->data + (long)local_594 * 4) = local_5ac;
        }
      }
      Mat::~Mat((Mat *)0x920a3a);
      Mat::~Mat((Mat *)0x920a47);
    }
    for (local_5b4 = 0; local_5b4 < local_44; local_5b4 = local_5b4 + 1) {
      local_5c0 = Mat::row(local_50,local_5b4);
      for (local_5c4 = 0; local_5c4 < *(int *)(in_RDI + 0xd0); local_5c4 = local_5c4 + 1) {
        Mat::channel(in_stack_fffffffffffff918,(int)((ulong)in_stack_fffffffffffff910 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_618);
        Mat::~Mat((Mat *)0x920b28);
        local_5d0 = pfVar3;
        pfVar3 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x290));
        iVar5 = *(int *)(in_RDI + 0xd0) * local_5c4;
        pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x2d8),(long)local_5c4);
        local_624 = *pfVar4;
        local_620 = pfVar3 + iVar5;
        for (local_628 = 0; local_628 < *(int *)(in_RDI + 0xd0); local_628 = local_628 + 1) {
          local_624 = *local_5d0 * *local_620 + local_624;
          local_620 = local_620 + 1;
          local_5d0 = local_5d0 + 1;
        }
        local_5c0[local_5c4] = local_624;
      }
    }
    local_4 = 0;
    Mat::~Mat((Mat *)0x920cb2);
    Mat::~Mat((Mat *)0x920cbf);
    Mat::~Mat((Mat *)0x920ccc);
    Mat::~Mat((Mat *)0x920cd9);
    Mat::~Mat((Mat *)0x920ce6);
  }
  return local_4;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[1];
    const Mat& v_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[2];

    const int seqlen = q_blob.h;
    const int embed_dim_per_head = embed_dim / num_head;

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xv(seqlen, embed_dim_per_head, num_head, 4u, opt.workspace_allocator);

    Mat xqk(seqlen, seqlen, num_head, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_head, seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrt(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_head; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + embed_dim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, seqlen)
        // xk  (embed_dim_per_head, seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] = (float)(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (seqlen, seqlen)
        // xv  (seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_head, seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}